

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sse_avx2.c
# Opt level: O2

int64_t aom_highbd_sse_avx2(uint8_t *a8,int a_stride,uint8_t *b8,int b_stride,int width,int height)

{
  bool bVar1;
  undefined1 auVar2 [16];
  long lVar3;
  int64_t iVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  undefined1 *puVar9;
  undefined1 *puVar10;
  int iVar11;
  undefined1 *puVar12;
  long lVar13;
  undefined1 *puVar14;
  undefined1 (*b) [32];
  undefined1 (*a) [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [64];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  __m256i local_100;
  long local_d8;
  long local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  undefined1 local_a0 [32];
  undefined1 local_80 [80];
  
  local_c0 = (ulong)(uint)b_stride;
  local_c8 = (ulong)(uint)a_stride;
  a = (undefined1 (*) [32])((long)a8 * 2);
  b = (undefined1 (*) [32])((long)b8 * 2);
  auVar16 = ZEXT1664((undefined1  [16])0x0);
  local_100 = auVar16._0_32_;
  if (width == 4) {
    local_a0._0_8_ = (long)(a_stride * 4) * 2;
    iVar7 = 0;
    do {
      highbd_sse_w4x4_avx2(&local_100,(uint16_t *)a,a_stride,(uint16_t *)b,b_stride);
      iVar7 = iVar7 + 4;
      a = (undefined1 (*) [32])(*a + local_a0._0_8_);
      b = (undefined1 (*) [32])(*b + (long)(b_stride * 4) * 2);
    } while (iVar7 < height);
LAB_0031087d:
    iVar4 = summary_all_avx2(&local_100);
    return iVar4;
  }
  if (width == 8) {
    iVar7 = 0;
    do {
      auVar19._0_16_ =
           ZEXT116(0) * *(undefined1 (*) [16])(*a + (long)a_stride * 2) +
           ZEXT116(1) * *(undefined1 (*) [16])*a;
      auVar19._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) * *(undefined1 (*) [16])(*a + (long)a_stride * 2);
      auVar24._0_16_ =
           ZEXT116(0) * *(undefined1 (*) [16])(*b + (long)b_stride * 2) +
           ZEXT116(1) * *(undefined1 (*) [16])*b;
      auVar24._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) * *(undefined1 (*) [16])(*b + (long)b_stride * 2);
      auVar19 = vpsubw_avx2(auVar19,auVar24);
      auVar19 = vpmaddwd_avx2(auVar19,auVar19);
      local_100 = (__m256i)vpaddd_avx2(auVar19,auVar16._0_32_);
      auVar16 = ZEXT3264((undefined1  [32])local_100);
      iVar7 = iVar7 + 2;
      a = (undefined1 (*) [32])(*a + (long)(a_stride * 2) * 2);
      b = (undefined1 (*) [32])(*b + (long)(b_stride * 2) * 2);
    } while (iVar7 < height);
    goto LAB_0031087d;
  }
  if (width == 0x10) {
    iVar7 = 0;
    do {
      auVar19 = vpsubw_avx2(*a,*b);
      auVar19 = vpmaddwd_avx2(auVar19,auVar19);
      local_100 = (__m256i)vpaddd_avx2(auVar19,auVar16._0_32_);
      auVar16 = ZEXT3264((undefined1  [32])local_100);
      iVar7 = iVar7 + 1;
      a = (undefined1 (*) [32])(*a + (long)a_stride * 2);
      b = (undefined1 (*) [32])(*b + (long)b_stride * 2);
    } while (iVar7 < height);
    goto LAB_0031087d;
  }
  if (width == 0x20) {
    iVar7 = 0;
    do {
      auVar21 = ZEXT1664((undefined1  [16])0x0);
      iVar11 = 1;
      do {
        auVar19 = vpsubw_avx2(*a,*b);
        auVar19 = vpmaddwd_avx2(auVar19,auVar19);
        auVar19 = vpaddd_avx2(auVar19,auVar21._0_32_);
        auVar24 = vpsubw_avx2(a[1],b[1]);
        auVar24 = vpmaddwd_avx2(auVar24,auVar24);
        auVar19 = vpaddd_avx2(auVar19,auVar24);
        auVar21 = ZEXT3264(auVar19);
        a = (undefined1 (*) [32])(*a + (long)a_stride * 2);
        b = (undefined1 (*) [32])(*b + (long)b_stride * 2);
        if (0x3e < iVar11 - 1U) break;
        bVar1 = iVar11 < height - iVar7;
        iVar11 = iVar11 + 1;
      } while (bVar1);
      auVar24 = vpmovzxdq_avx2(auVar19._0_16_);
      auVar24 = vpaddq_avx2(auVar24,auVar16._0_32_);
      auVar19 = vpmovzxdq_avx2(auVar19._16_16_);
      auVar19 = vpaddq_avx2(auVar24,auVar19);
      auVar16 = ZEXT3264(auVar19);
      iVar7 = iVar7 + 0x40;
    } while (iVar7 < height);
  }
  else if (width == 0x40) {
    iVar7 = 0;
    do {
      auVar21 = ZEXT1664((undefined1  [16])0x0);
      iVar11 = 1;
      do {
        auVar19 = vpsubw_avx2(*a,*b);
        auVar19 = vpmaddwd_avx2(auVar19,auVar19);
        auVar19 = vpaddd_avx2(auVar19,auVar21._0_32_);
        auVar24 = vpsubw_avx2(a[1],b[1]);
        auVar24 = vpmaddwd_avx2(auVar24,auVar24);
        auVar20 = vpsubw_avx2(a[2],b[2]);
        auVar20 = vpmaddwd_avx2(auVar20,auVar20);
        auVar24 = vpaddd_avx2(auVar24,auVar20);
        auVar19 = vpaddd_avx2(auVar19,auVar24);
        auVar24 = vpsubw_avx2(a[3],b[3]);
        auVar24 = vpmaddwd_avx2(auVar24,auVar24);
        auVar19 = vpaddd_avx2(auVar19,auVar24);
        auVar21 = ZEXT3264(auVar19);
        a = (undefined1 (*) [32])(*a + (long)a_stride * 2);
        b = (undefined1 (*) [32])(*b + (long)b_stride * 2);
        if (0x1e < iVar11 - 1U) break;
        bVar1 = iVar11 < height - iVar7;
        iVar11 = iVar11 + 1;
      } while (bVar1);
      auVar24 = vpmovzxdq_avx2(auVar19._0_16_);
      auVar24 = vpaddq_avx2(auVar24,auVar16._0_32_);
      auVar19 = vpmovzxdq_avx2(auVar19._16_16_);
      auVar19 = vpaddq_avx2(auVar24,auVar19);
      auVar16 = ZEXT3264(auVar19);
      iVar7 = iVar7 + 0x20;
    } while (iVar7 < height);
  }
  else {
    if (width != 0x80) {
      lVar3 = (long)(b_stride * 2);
      if ((width & 7U) == 0) {
        iVar7 = 0;
        auVar16 = ZEXT1664((undefined1  [16])0x0);
        do {
          auVar21 = ZEXT1664((undefined1  [16])0x0);
          uVar8 = 0;
          do {
            lVar13 = 0;
            do {
              auVar20._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])(*a + lVar13 * 2 + (long)a_stride * 2) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*a + lVar13 * 2);
              auVar20._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*a + lVar13 * 2 + (long)a_stride * 2);
              auVar25._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])(*b + lVar13 * 2 + (long)b_stride * 2) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*b + lVar13 * 2);
              auVar25._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*b + lVar13 * 2 + (long)b_stride * 2);
              auVar19 = vpsubw_avx2(auVar20,auVar25);
              auVar19 = vpmaddwd_avx2(auVar19,auVar19);
              auVar19 = vpaddd_avx2(auVar19,auVar21._0_32_);
              auVar21 = ZEXT3264(auVar19);
              lVar13 = lVar13 + 8;
            } while (lVar13 < width);
            a = (undefined1 (*) [32])(*a + (long)(a_stride * 2) * 2);
            b = (undefined1 (*) [32])(*b + lVar3 * 2);
          } while ((uVar8 < 6) && (uVar8 = uVar8 + 2, (int)uVar8 < height - iVar7));
          auVar24 = vpmovzxdq_avx2(auVar19._0_16_);
          auVar24 = vpaddq_avx2(auVar24,auVar16._0_32_);
          auVar19 = vpmovzxdq_avx2(auVar19._16_16_);
          local_100 = (__m256i)vpaddq_avx2(auVar24,auVar19);
          auVar16 = ZEXT3264((undefined1  [32])local_100);
          iVar7 = iVar7 + 8;
        } while (iVar7 < height);
      }
      else {
        local_d8 = (long)(b_stride * 4) * 2;
        puVar10 = *b + (long)b_stride * 2;
        local_a8 = *b + lVar3 * 2;
        local_b0 = *b + lVar3 * 2 + (long)b_stride * 2;
        local_d0 = (long)(a_stride * 4) * 2;
        puVar14 = *a + (long)a_stride * 2;
        puVar9 = *a + (long)(a_stride * 2) * 2;
        puVar12 = *a + (long)(a_stride * 2) * 2 + (long)a_stride * 2;
        local_b8 = 0;
        auVar16 = ZEXT1664((undefined1  [16])0x0);
        do {
          local_a0 = auVar16._0_32_;
          auVar16 = ZEXT1664((undefined1  [16])0x0);
          uVar5 = 0;
          do {
            auVar17._0_16_ =
                 ZEXT116(0) * *(undefined1 (*) [16])(puVar14 + uVar5 * 2) +
                 ZEXT116(1) * *(undefined1 (*) [16])(*a + uVar5 * 2);
            auVar17._16_16_ =
                 ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                 ZEXT116(1) * *(undefined1 (*) [16])(puVar14 + uVar5 * 2);
            auVar22._0_16_ =
                 ZEXT116(0) * *(undefined1 (*) [16])(puVar10 + uVar5 * 2) +
                 ZEXT116(1) * *(undefined1 (*) [16])(*b + uVar5 * 2);
            auVar22._16_16_ =
                 ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                 ZEXT116(1) * *(undefined1 (*) [16])(puVar10 + uVar5 * 2);
            auVar19 = vpsubw_avx2(auVar17,auVar22);
            auVar19 = vpmaddwd_avx2(auVar19,auVar19);
            auVar19 = vpaddd_avx2(auVar19,auVar16._0_32_);
            auVar18._0_16_ =
                 ZEXT116(0) * *(undefined1 (*) [16])(puVar12 + uVar5 * 2) +
                 ZEXT116(1) * *(undefined1 (*) [16])(puVar9 + uVar5 * 2);
            auVar18._16_16_ =
                 ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                 ZEXT116(1) * *(undefined1 (*) [16])(puVar12 + uVar5 * 2);
            auVar23._0_16_ =
                 ZEXT116(0) * *(undefined1 (*) [16])(local_b0 + uVar5 * 2) +
                 ZEXT116(1) * *(undefined1 (*) [16])(local_a8 + uVar5 * 2);
            auVar23._16_16_ =
                 ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                 ZEXT116(1) * *(undefined1 (*) [16])(local_b0 + uVar5 * 2);
            auVar24 = vpsubw_avx2(auVar18,auVar23);
            auVar24 = vpmaddwd_avx2(auVar24,auVar24);
            local_80._0_32_ = vpaddd_avx2(auVar24,auVar19);
            auVar16 = ZEXT3264(local_80._0_32_);
            uVar6 = uVar5 + 8;
            iVar7 = (int)uVar5;
            uVar5 = uVar6;
          } while (iVar7 + 0xc < width);
          lVar3 = (uVar6 & 0xffffffff) * 2;
          highbd_sse_w4x4_avx2
                    ((__m256i *)local_80,(uint16_t *)(*a + lVar3),(int)local_c8,
                     (uint16_t *)(*b + lVar3),(int)local_c0);
          auVar24 = vpmovzxdq_avx2(local_80._0_16_);
          auVar19 = vpmovzxdq_avx2(local_80._16_16_);
          auVar19 = vpaddq_avx2(auVar19,local_a0);
          local_100 = (__m256i)vpaddq_avx2(auVar19,auVar24);
          auVar16 = ZEXT3264((undefined1  [32])local_100);
          a = (undefined1 (*) [32])(*a + local_d0);
          b = (undefined1 (*) [32])(*b + local_d8);
          uVar8 = (int)local_b8 + 4;
          local_b8 = (ulong)uVar8;
          puVar10 = puVar10 + local_d8;
          local_a8 = local_a8 + local_d8;
          local_b0 = local_b0 + local_d8;
          puVar14 = puVar14 + local_d0;
          puVar9 = puVar9 + local_d0;
          puVar12 = puVar12 + local_d0;
        } while ((int)uVar8 < height);
      }
      auVar15 = vpaddq_avx(local_100._0_16_,local_100._16_16_);
      goto LAB_00310944;
    }
    iVar7 = 0;
    do {
      auVar21 = ZEXT1664((undefined1  [16])0x0);
      iVar11 = 1;
      do {
        auVar19 = vpsubw_avx2(*a,*b);
        auVar19 = vpmaddwd_avx2(auVar19,auVar19);
        auVar19 = vpaddd_avx2(auVar19,auVar21._0_32_);
        auVar24 = vpsubw_avx2(a[1],b[1]);
        auVar24 = vpmaddwd_avx2(auVar24,auVar24);
        auVar20 = vpsubw_avx2(a[2],b[2]);
        auVar20 = vpmaddwd_avx2(auVar20,auVar20);
        auVar24 = vpaddd_avx2(auVar24,auVar20);
        auVar19 = vpaddd_avx2(auVar19,auVar24);
        auVar24 = vpsubw_avx2(a[3],b[3]);
        auVar24 = vpmaddwd_avx2(auVar24,auVar24);
        auVar20 = vpsubw_avx2(a[4],b[4]);
        auVar20 = vpmaddwd_avx2(auVar20,auVar20);
        auVar24 = vpaddd_avx2(auVar24,auVar20);
        auVar20 = vpsubw_avx2(a[5],b[5]);
        auVar20 = vpmaddwd_avx2(auVar20,auVar20);
        auVar24 = vpaddd_avx2(auVar24,auVar20);
        auVar19 = vpaddd_avx2(auVar19,auVar24);
        auVar24 = vpsubw_avx2(a[6],b[6]);
        auVar24 = vpmaddwd_avx2(auVar24,auVar24);
        auVar20 = vpsubw_avx2(a[7],b[7]);
        auVar20 = vpmaddwd_avx2(auVar20,auVar20);
        auVar24 = vpaddd_avx2(auVar24,auVar20);
        auVar19 = vpaddd_avx2(auVar19,auVar24);
        auVar21 = ZEXT3264(auVar19);
        a = (undefined1 (*) [32])(*a + (long)a_stride * 2);
        b = (undefined1 (*) [32])(*b + (long)b_stride * 2);
        if (0xe < iVar11 - 1U) break;
        bVar1 = iVar11 < height - iVar7;
        iVar11 = iVar11 + 1;
      } while (bVar1);
      auVar24 = vpmovzxdq_avx2(auVar19._0_16_);
      auVar24 = vpaddq_avx2(auVar24,auVar16._0_32_);
      auVar19 = vpmovzxdq_avx2(auVar19._16_16_);
      auVar19 = vpaddq_avx2(auVar24,auVar19);
      auVar16 = ZEXT3264(auVar19);
      iVar7 = iVar7 + 0x10;
    } while (iVar7 < height);
  }
  auVar15 = vpaddq_avx(auVar19._0_16_,auVar19._16_16_);
LAB_00310944:
  auVar2 = vpshufd_avx(auVar15,0xee);
  auVar15 = vpaddq_avx(auVar15,auVar2);
  return auVar15._0_8_;
}

Assistant:

int64_t aom_highbd_sse_avx2(const uint8_t *a8, int a_stride, const uint8_t *b8,
                            int b_stride, int width, int height) {
  int32_t y = 0;
  int64_t sse = 0;
  uint16_t *a = CONVERT_TO_SHORTPTR(a8);
  uint16_t *b = CONVERT_TO_SHORTPTR(b8);
  __m256i sum = _mm256_setzero_si256();
  switch (width) {
    case 4:
      do {
        highbd_sse_w4x4_avx2(&sum, a, a_stride, b, b_stride);
        a += a_stride << 2;
        b += b_stride << 2;
        y += 4;
      } while (y < height);
      sse = summary_all_avx2(&sum);
      break;
    case 8:
      do {
        highbd_sse_w8x2_avx2(&sum, a, a_stride, b, b_stride);
        a += a_stride << 1;
        b += b_stride << 1;
        y += 2;
      } while (y < height);
      sse = summary_all_avx2(&sum);
      break;
    case 16:
      do {
        highbd_sse_w16_avx2(&sum, a, b);
        a += a_stride;
        b += b_stride;
        y += 1;
      } while (y < height);
      sse = summary_all_avx2(&sum);
      break;
    case 32:
      do {
        int l = 0;
        __m256i sum32 = _mm256_setzero_si256();
        do {
          highbd_sse_w16_avx2(&sum32, a, b);
          highbd_sse_w16_avx2(&sum32, a + 16, b + 16);
          a += a_stride;
          b += b_stride;
          l += 1;
        } while (l < 64 && l < (height - y));
        summary_32_avx2(&sum32, &sum);
        y += 64;
      } while (y < height);
      sse = summary_4x64_avx2(sum);
      break;
    case 64:
      do {
        int l = 0;
        __m256i sum32 = _mm256_setzero_si256();
        do {
          highbd_sse_w16_avx2(&sum32, a, b);
          highbd_sse_w16_avx2(&sum32, a + 16 * 1, b + 16 * 1);
          highbd_sse_w16_avx2(&sum32, a + 16 * 2, b + 16 * 2);
          highbd_sse_w16_avx2(&sum32, a + 16 * 3, b + 16 * 3);
          a += a_stride;
          b += b_stride;
          l += 1;
        } while (l < 32 && l < (height - y));
        summary_32_avx2(&sum32, &sum);
        y += 32;
      } while (y < height);
      sse = summary_4x64_avx2(sum);
      break;
    case 128:
      do {
        int l = 0;
        __m256i sum32 = _mm256_setzero_si256();
        do {
          highbd_sse_w16_avx2(&sum32, a, b);
          highbd_sse_w16_avx2(&sum32, a + 16 * 1, b + 16 * 1);
          highbd_sse_w16_avx2(&sum32, a + 16 * 2, b + 16 * 2);
          highbd_sse_w16_avx2(&sum32, a + 16 * 3, b + 16 * 3);
          highbd_sse_w16_avx2(&sum32, a + 16 * 4, b + 16 * 4);
          highbd_sse_w16_avx2(&sum32, a + 16 * 5, b + 16 * 5);
          highbd_sse_w16_avx2(&sum32, a + 16 * 6, b + 16 * 6);
          highbd_sse_w16_avx2(&sum32, a + 16 * 7, b + 16 * 7);
          a += a_stride;
          b += b_stride;
          l += 1;
        } while (l < 16 && l < (height - y));
        summary_32_avx2(&sum32, &sum);
        y += 16;
      } while (y < height);
      sse = summary_4x64_avx2(sum);
      break;
    default:
      if (width & 0x7) {
        do {
          int i = 0;
          __m256i sum32 = _mm256_setzero_si256();
          do {
            highbd_sse_w8x2_avx2(&sum32, a + i, a_stride, b + i, b_stride);
            const uint16_t *a2 = a + i + (a_stride << 1);
            const uint16_t *b2 = b + i + (b_stride << 1);
            highbd_sse_w8x2_avx2(&sum32, a2, a_stride, b2, b_stride);
            i += 8;
          } while (i + 4 < width);
          highbd_sse_w4x4_avx2(&sum32, a + i, a_stride, b + i, b_stride);
          summary_32_avx2(&sum32, &sum);
          a += a_stride << 2;
          b += b_stride << 2;
          y += 4;
        } while (y < height);
      } else {
        do {
          int l = 0;
          __m256i sum32 = _mm256_setzero_si256();
          do {
            int i = 0;
            do {
              highbd_sse_w8x2_avx2(&sum32, a + i, a_stride, b + i, b_stride);
              i += 8;
            } while (i < width);
            a += a_stride << 1;
            b += b_stride << 1;
            l += 2;
          } while (l < 8 && l < (height - y));
          summary_32_avx2(&sum32, &sum);
          y += 8;
        } while (y < height);
      }
      sse = summary_4x64_avx2(sum);
      break;
  }
  return sse;
}